

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkCompatibility
          (CompatibilityChecker *this,Reader *type,Reader *replacement,
          UpgradeToStructMode upgradeToStructMode)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  Exception *pEVar4;
  ushort uVar5;
  Maybe<capnp::schema::Node::Reader> *matchSize;
  short sVar6;
  undefined2 uVar7;
  uint64_t structTypeId;
  int iVar8;
  short sVar9;
  Maybe<capnp::schema::Field::Reader> *matchPosition;
  Fault *this_00;
  CapTableReader *pCVar10;
  Fault f;
  Fault f_1;
  PointerReader local_120;
  Maybe<capnp::schema::Field::Reader> local_100;
  Maybe<capnp::schema::Node::Reader> local_c8;
  Maybe<capnp::schema::Field::Reader> local_90;
  Maybe<capnp::schema::Node::Reader> local_58;
  
  uVar1 = (replacement->_reader).dataSize;
  if (uVar1 < 0x10) {
    sVar6 = 0;
  }
  else {
    sVar6 = *(replacement->_reader).data;
  }
  uVar2 = (type->_reader).dataSize;
  if (uVar2 < 0x10) {
    sVar9 = 0;
  }
  else {
    sVar9 = *(type->_reader).data;
  }
  if (sVar6 == sVar9) {
    if (uVar2 < 0x10) {
      uVar7 = 0;
    }
    else {
      uVar7 = *(type->_reader).data;
    }
    switch(uVar7) {
    case 0xe:
      iVar8 = 0x7fffffff;
      if ((type->_reader).pointerCount == 0) {
        f_1.exception = (Exception *)0x0;
      }
      else {
        f_1.exception = (Exception *)(type->_reader).segment;
      }
      pCVar10 = (CapTableReader *)0x0;
      _::PointerReader::getStruct((StructReader *)&f,(PointerReader *)&f_1,(word *)0x0);
      local_120.pointer = (WirePointer *)0x0;
      local_120.segment = (SegmentReader *)0x0;
      if ((replacement->_reader).pointerCount != 0) {
        iVar8 = (replacement->_reader).nestingLimit;
        local_120.pointer = (replacement->_reader).pointers;
        local_120.segment = (replacement->_reader).segment;
        pCVar10 = (replacement->_reader).capTable;
      }
      local_120.capTable = pCVar10;
      local_120.nestingLimit = iVar8;
      _::PointerReader::getStruct((StructReader *)&f_1,&local_120,(word *)0x0);
      checkCompatibility(this,(Reader *)&f,(Reader *)&f_1,ALLOW_UPGRADE_TO_STRUCT);
      return;
    case 0xf:
      if (uVar1 < 0x80) {
        f.exception = (Exception *)0x0;
      }
      else {
        f.exception = *(Exception **)((long)(replacement->_reader).data + 8);
      }
      if (uVar2 < 0x80) {
        pEVar4 = (Exception *)0x0;
      }
      else {
        pEVar4 = *(Exception **)((long)(type->_reader).data + 8);
      }
      if (f.exception == pEVar4) {
        return;
      }
      this_00 = &f_1;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&,char_const(&)[23]>
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,1000,FAILED,"replacement.getEnum().getTypeId() == type.getEnum().getTypeId()",
                 "_kjCondition,\"type changed enum type\"",
                 (DebugComparison<unsigned_long,_unsigned_long> *)&f,
                 (char (*) [23])"type changed enum type");
      break;
    case 0x10:
      if (uVar1 < 0x80) {
        f.exception = (Exception *)0x0;
      }
      else {
        f.exception = *(Exception **)((long)(replacement->_reader).data + 8);
      }
      if (uVar2 < 0x80) {
        pEVar4 = (Exception *)0x0;
      }
      else {
        pEVar4 = *(Exception **)((long)(type->_reader).data + 8);
      }
      if (f.exception == pEVar4) {
        return;
      }
      this_00 = &f_1;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&,char_const(&)[41]>
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x3f4,FAILED,"replacement.getStruct().getTypeId() == type.getStruct().getTypeId()"
                 ,"_kjCondition,\"type changed to incompatible struct type\"",
                 (DebugComparison<unsigned_long,_unsigned_long> *)&f,
                 (char (*) [41])"type changed to incompatible struct type");
      break;
    case 0x11:
      if (uVar1 < 0x80) {
        f.exception = (Exception *)0x0;
      }
      else {
        f.exception = *(Exception **)((long)(replacement->_reader).data + 8);
      }
      if (uVar2 < 0x80) {
        pEVar4 = (Exception *)0x0;
      }
      else {
        pEVar4 = *(Exception **)((long)(type->_reader).data + 8);
      }
      if (f.exception == pEVar4) {
        return;
      }
      this_00 = &f_1;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&,char_const(&)[44]>
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x3f9,FAILED,
                 "replacement.getInterface().getTypeId() == type.getInterface().getTypeId()",
                 "_kjCondition,\"type changed to incompatible interface type\"",
                 (DebugComparison<unsigned_long,_unsigned_long> *)&f,
                 (char (*) [44])"type changed to incompatible interface type");
      break;
    default:
      goto switchD_001ac0c1_default;
    }
  }
  else {
    if (((0xf < uVar1) && (*(replacement->_reader).data == 0xd)) &&
       (bVar3 = canUpgradeToData(this,type), bVar3)) {
LAB_001ac026:
      replacementIsNewer(this);
      return;
    }
    if (((0xf < (type->_reader).dataSize) && (*(type->_reader).data == 0xd)) &&
       (bVar3 = canUpgradeToData(this,replacement), bVar3)) {
LAB_001ac05b:
      replacementIsOlder(this);
      return;
    }
    uVar1 = (replacement->_reader).dataSize;
    if ((0xf < uVar1) && (*(replacement->_reader).data == 0x12)) {
      if ((type->_reader).dataSize < 0x10) {
        uVar5 = 0;
      }
      else {
        uVar5 = *(type->_reader).data;
      }
      if ((0xb < uVar5) && (uVar5 != 0xf)) goto LAB_001ac026;
    }
    uVar2 = (type->_reader).dataSize;
    if ((0xf < uVar2) && (*(type->_reader).data == 0x12)) {
      if (uVar1 < 0x10) {
        uVar5 = 0;
      }
      else {
        uVar5 = *(replacement->_reader).data;
      }
      if ((0xb < uVar5) && (uVar5 != 0xf)) goto LAB_001ac05b;
    }
    if (upgradeToStructMode == ALLOW_UPGRADE_TO_STRUCT) {
      if ((0xf < uVar2) && (*(type->_reader).data == 0x10)) {
        if (uVar2 < 0x80) {
          structTypeId = 0;
        }
        else {
          structTypeId = *(uint64_t *)((long)(type->_reader).data + 8);
        }
        matchSize = &local_58;
        local_58.ptr.isSet = false;
        matchPosition = &local_90;
        local_90.ptr.isSet = false;
LAB_001ac476:
        checkUpgradeToStruct(this,replacement,structTypeId,matchSize,matchPosition);
        return;
      }
      if ((0xf < uVar1) && (*(replacement->_reader).data == 0x10)) {
        if (uVar1 < 0x80) {
          structTypeId = 0;
        }
        else {
          structTypeId = *(uint64_t *)((long)(replacement->_reader).data + 8);
        }
        matchSize = &local_c8;
        local_c8.ptr.isSet = false;
        matchPosition = &local_100;
        local_100.ptr.isSet = false;
        replacement = type;
        goto LAB_001ac476;
      }
    }
    this_00 = &f;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x3cc,FAILED,(char *)0x0,"\"a type was changed\"",
               (char (*) [19])"a type was changed");
  }
  this->compatibility = INCOMPATIBLE;
  kj::_::Debug::Fault::~Fault(this_00);
switchD_001ac0c1_default:
  return;
}

Assistant:

void checkCompatibility(const schema::Type::Reader& type,
                          const schema::Type::Reader& replacement,
                          UpgradeToStructMode upgradeToStructMode) {
    if (replacement.which() != type.which()) {
      // Check for allowed "upgrade" to Data or AnyPointer.
      if (replacement.isData() && canUpgradeToData(type)) {
        replacementIsNewer();
        return;
      } else if (type.isData() && canUpgradeToData(replacement)) {
        replacementIsOlder();
        return;
      } else if (replacement.isAnyPointer() && canUpgradeToAnyPointer(type)) {
        replacementIsNewer();
        return;
      } else if (type.isAnyPointer() && canUpgradeToAnyPointer(replacement)) {
        replacementIsOlder();
        return;
      }

      if (upgradeToStructMode == ALLOW_UPGRADE_TO_STRUCT) {
        if (type.isStruct()) {
          checkUpgradeToStruct(replacement, type.getStruct().getTypeId());
          return;
        } else if (replacement.isStruct()) {
          checkUpgradeToStruct(type, replacement.getStruct().getTypeId());
          return;
        }
      }

      FAIL_VALIDATE_SCHEMA("a type was changed");
    }

    switch (type.which()) {
      case schema::Type::VOID:
      case schema::Type::BOOL:
      case schema::Type::INT8:
      case schema::Type::INT16:
      case schema::Type::INT32:
      case schema::Type::INT64:
      case schema::Type::UINT8:
      case schema::Type::UINT16:
      case schema::Type::UINT32:
      case schema::Type::UINT64:
      case schema::Type::FLOAT32:
      case schema::Type::FLOAT64:
      case schema::Type::TEXT:
      case schema::Type::DATA:
      case schema::Type::ANY_POINTER:
        return;

      case schema::Type::LIST:
        checkCompatibility(type.getList().getElementType(), replacement.getList().getElementType(),
                           ALLOW_UPGRADE_TO_STRUCT);
        return;

      case schema::Type::ENUM:
        VALIDATE_SCHEMA(replacement.getEnum().getTypeId() == type.getEnum().getTypeId(),
                        "type changed enum type");
        return;

      case schema::Type::STRUCT:
        // TODO(someday):  If the IDs don't match, we should compare the two structs for
        //   compatibility.  This is tricky, though, because the new type's target may not yet be
        //   loaded.  In that case we could take the old type, make a copy of it, assign the new
        //   ID to the copy, and load() that.  That forces any struct type loaded for that ID to
        //   be compatible.  However, that has another problem, which is that it could be that the
        //   whole reason the type was replaced was to fork that type, and so an incompatibility
        //   could be very much expected.  This could be a rat hole...
        VALIDATE_SCHEMA(replacement.getStruct().getTypeId() == type.getStruct().getTypeId(),
                        "type changed to incompatible struct type");
        return;

      case schema::Type::INTERFACE:
        VALIDATE_SCHEMA(replacement.getInterface().getTypeId() == type.getInterface().getTypeId(),
                        "type changed to incompatible interface type");
        return;
    }

    // We assume unknown types (from newer versions of Cap'n Proto?) are equivalent.
  }